

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O0

unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)> __thiscall
pstore::repo::fragment::
load_impl<std::unique_ptr<pstore::repo::fragment_const,void(*)(pstore::repo::fragment_const*)>,pstore::repo::fragment::loadu(pstore::database_const&,pstore::extent<pstore::repo::fragment>const&)::__0>
          (fragment *this,extent<pstore::repo::fragment> *fext,anon_class_8_1_3fcf653c get)

{
  bool bVar1;
  type f_00;
  _Head_base<0UL,_const_pstore::repo::fragment_*,_false> extraout_RDX;
  unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)> uVar2;
  extent<pstore::repo::fragment> *fext_local;
  anon_class_8_1_3fcf653c get_local;
  unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)> *f;
  
  fext_local = (extent<pstore::repo::fragment> *)get.db;
  get_local.db = (database *)this;
  if (fext->size < 0x20) {
    raise<pstore::repo::error_code>(bad_fragment_record);
  }
  loadu::anon_class_8_1_3fcf653c::operator()
            ((anon_class_8_1_3fcf653c *)this,(extent<pstore::repo::fragment> *)&fext_local);
  f_00 = std::unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>::
         operator*((unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>
                    *)this);
  bVar1 = fragment_appears_valid(f_00,fext);
  if (bVar1) {
    uVar2._M_t.
    super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>.
    _M_t.
    super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    .super__Head_base<0UL,_const_pstore::repo::fragment_*,_false>._M_head_impl =
         extraout_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>.
    _M_t.
    super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    .super__Tuple_impl<1UL,_void_(*)(const_pstore::repo::fragment_*)>.
    super__Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)
         (_Head_base<1UL,_void_(*)(const_pstore::repo::fragment_*),_false>)this;
    return (unique_ptr<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>)
           uVar2._M_t.
           super___uniq_ptr_impl<const_pstore::repo::fragment,_void_(*)(const_pstore::repo::fragment_*)>
           ._M_t.
           super__Tuple_impl<0UL,_const_pstore::repo::fragment_*,_void_(*)(const_pstore::repo::fragment_*)>
    ;
  }
  raise<pstore::repo::error_code>(bad_fragment_record);
}

Assistant:

auto fragment::load_impl (extent<fragment> const & fext, GetOp get) -> ReturnType {
            if (fext.size < sizeof (fragment)) {
                raise (error_code::bad_fragment_record);
            }

            ReturnType f = get (fext);
            if (!fragment::fragment_appears_valid (*f, fext)) {
                raise (error_code::bad_fragment_record);
            }
            return f;
        }